

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall IVmBifTadsRNG::get_state(IVmBifTadsRNG *this,vm_val_t *val)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  undefined4 extraout_var;
  char *buf;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  ulong len;
  
  iVar3 = (*this->_vptr_IVmBifTadsRNG[6])();
  len = CONCAT44(extraout_var,iVar3);
  if (len == 0) {
    iVar3 = (*this->_vptr_IVmBifTadsRNG[7])(this);
    val->typ = VM_INT;
    (val->val).intval = iVar3;
  }
  else {
    buf = (char *)operator_new__(len);
    G_err_frame::__tls_init();
    local_108 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_110;
    local_110[0] = _setjmp(&local_f8);
    if (local_110[0] == 0) {
      (*this->_vptr_IVmBifTadsRNG[9])(this,buf);
      vVar4 = CVmObjByteArray::create_from_bytes(0,buf,len);
      val->typ = VM_OBJ;
      (val->val).obj = vVar4;
    }
    if (-1 < (short)local_110[0]) {
      local_110[0] = local_110[0] | 0x8000;
      operator_delete__(buf);
    }
    lVar1 = local_108;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_110[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_100;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_110[0] & 2) != 0) {
      free(local_100);
    }
  }
  return;
}

Assistant:

void get_state(VMG_ vm_val_t *val)
    {
        size_t len = get_state_size();
        if (len == 0)
        {
            /* simple int32_t state */
            val->set_int(get_state_int());
        }
        else
        {
            /* allocate a buffer */
            char *buf = new char[len];

            /* make sure we delete the allocated buffer */
            err_try
            {
                /* get the state into our buffer */
                get_state_buf(buf);

                /* create a ByteArray from the state vector */
                val->set_obj(CVmObjByteArray::create_from_bytes(
                    vmg_ FALSE, buf, len));
            }
            err_finally
            {
                /* done with the buffer */
                delete [] buf;
            }